

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_upload(Curl_easy *data)

{
  FILEPROTO *data_00;
  int iVar1;
  curltime cVar2;
  curltime now;
  byte local_119;
  size_t local_108;
  size_t readcount;
  ssize_t nwrite;
  size_t nread;
  void *pvStack_e8;
  _Bool eos;
  char *sendbuf;
  stat file_stat;
  curl_off_t bytecount;
  size_t xfer_ulblen;
  char *xfer_ulbuf;
  int local_30;
  CURLcode result;
  int mode;
  int fd;
  char *dir;
  FILEPROTO *file;
  Curl_easy *data_local;
  
  dir = (char *)(data->req).p.file;
  file = (FILEPROTO *)data;
  _mode = strchr(((FILEPROTO *)dir)->path,0x2f);
  xfer_ulbuf._4_4_ = 0;
  file_stat.__glibc_reserved[2] = 0;
  nread._7_1_ = 0;
  if (_mode == (char *)0x0) {
    data_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else if (_mode[1] == '\0') {
    data_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else {
    if (*(long *)&file[0xbb].fd == 0) {
      local_30 = 0x241;
    }
    else {
      local_30 = 0x441;
    }
    result = open64(*(char **)dir,local_30,(ulong)*(uint *)&file[0x4d].field_0x14);
    if ((int)result < 0) {
      Curl_failf((Curl_easy *)file,"cannot open %s for writing",*(undefined8 *)dir);
      data_local._4_4_ = CURLE_WRITE_ERROR;
    }
    else {
      if (file[0xbe].freepath != (char *)0xffffffffffffffff) {
        Curl_pgrsSetUploadSize((Curl_easy *)file,(curl_off_t)file[0xbe].freepath);
      }
      if (*(long *)&file[0xbb].fd < 0) {
        iVar1 = fstat64(result,(stat64 *)&sendbuf);
        if (iVar1 != 0) {
          close(result);
          Curl_failf((Curl_easy *)file,"cannot get the size of %s",*(undefined8 *)dir);
          return CURLE_WRITE_ERROR;
        }
        *(__dev_t *)&file[0xbb].fd = file_stat.st_rdev;
      }
      xfer_ulbuf._4_4_ =
           Curl_multi_xfer_ulbuf_borrow
                     ((Curl_easy *)file,(char **)&xfer_ulblen,(size_t *)&bytecount);
      if (xfer_ulbuf._4_4_ == CURLE_OK) {
        while( true ) {
          local_119 = 0;
          if (xfer_ulbuf._4_4_ == CURLE_OK) {
            local_119 = nread._7_1_ ^ 0xff;
          }
          if ((((local_119 & 1) == 0) ||
              (xfer_ulbuf._4_4_ =
                    Curl_client_read((Curl_easy *)file,(char *)xfer_ulblen,bytecount,&local_108,
                                     (_Bool *)((long)&nread + 7)), xfer_ulbuf._4_4_ != CURLE_OK)) ||
             (local_108 == 0)) goto LAB_00135be7;
          nwrite = local_108;
          if (*(long *)&file[0xbb].fd == 0) {
            pvStack_e8 = (void *)xfer_ulblen;
          }
          else if (*(long *)&file[0xbb].fd < (long)local_108) {
            pvStack_e8 = (void *)(xfer_ulblen + *(long *)&file[0xbb].fd);
            nwrite = local_108 - *(long *)&file[0xbb].fd;
            *(undefined8 *)&file[0xbb].fd = 0;
          }
          else {
            *(size_t *)&file[0xbb].fd = *(long *)&file[0xbb].fd - local_108;
            nwrite = 0;
            pvStack_e8 = (void *)xfer_ulblen;
          }
          readcount = write(result,pvStack_e8,nwrite);
          if (readcount != nwrite) break;
          file_stat.__glibc_reserved[2] = nwrite + file_stat.__glibc_reserved[2];
          Curl_pgrsSetUploadCounter((Curl_easy *)file,file_stat.__glibc_reserved[2]);
          iVar1 = Curl_pgrsUpdate((Curl_easy *)file);
          data_00 = file;
          if (iVar1 == 0) {
            cVar2 = Curl_now();
            now._12_4_ = 0;
            now.tv_sec = SUB128(cVar2._0_12_,0);
            now.tv_usec = SUB124(cVar2._0_12_,8);
            xfer_ulbuf._4_4_ = Curl_speedcheck((Curl_easy *)data_00,now);
          }
          else {
            xfer_ulbuf._4_4_ = CURLE_ABORTED_BY_CALLBACK;
          }
        }
        xfer_ulbuf._4_4_ = CURLE_SEND_ERROR;
LAB_00135be7:
        if ((xfer_ulbuf._4_4_ == CURLE_OK) &&
           (iVar1 = Curl_pgrsUpdate((Curl_easy *)file), iVar1 != 0)) {
          xfer_ulbuf._4_4_ = CURLE_ABORTED_BY_CALLBACK;
        }
      }
      close(result);
      Curl_multi_xfer_ulbuf_release((Curl_easy *)file,(char *)xfer_ulblen);
      data_local._4_4_ = xfer_ulbuf._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode file_upload(struct Curl_easy *data)
{
  struct FILEPROTO *file = data->req.p.file;
  const char *dir = strchr(file->path, DIRSEP);
  int fd;
  int mode;
  CURLcode result = CURLE_OK;
  char *xfer_ulbuf;
  size_t xfer_ulblen;
  curl_off_t bytecount = 0;
  struct_stat file_stat;
  const char *sendbuf;
  bool eos = FALSE;

  /*
   * Since FILE: does not do the full init, we need to provide some extra
   * assignments here.
   */

  if(!dir)
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

  if(!dir[1])
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

#ifdef O_BINARY
#define MODE_DEFAULT O_WRONLY|O_CREAT|O_BINARY
#else
#define MODE_DEFAULT O_WRONLY|O_CREAT
#endif

  if(data->state.resume_from)
    mode = MODE_DEFAULT|O_APPEND;
  else
    mode = MODE_DEFAULT|O_TRUNC;

  fd = open(file->path, mode, data->set.new_file_perms);
  if(fd < 0) {
    failf(data, "cannot open %s for writing", file->path);
    return CURLE_WRITE_ERROR;
  }

  if(-1 != data->state.infilesize)
    /* known size of data to "upload" */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

  /* treat the negative resume offset value as the case of "-" */
  if(data->state.resume_from < 0) {
    if(fstat(fd, &file_stat)) {
      close(fd);
      failf(data, "cannot get the size of %s", file->path);
      return CURLE_WRITE_ERROR;
    }
    data->state.resume_from = (curl_off_t)file_stat.st_size;
  }

  result = Curl_multi_xfer_ulbuf_borrow(data, &xfer_ulbuf, &xfer_ulblen);
  if(result)
    goto out;

  while(!result && !eos) {
    size_t nread;
    ssize_t nwrite;
    size_t readcount;

    result = Curl_client_read(data, xfer_ulbuf, xfer_ulblen, &readcount, &eos);
    if(result)
      break;

    if(!readcount)
      break;

    nread = readcount;

    /* skip bytes before resume point */
    if(data->state.resume_from) {
      if((curl_off_t)nread <= data->state.resume_from) {
        data->state.resume_from -= nread;
        nread = 0;
        sendbuf = xfer_ulbuf;
      }
      else {
        sendbuf = xfer_ulbuf + data->state.resume_from;
        nread -= (size_t)data->state.resume_from;
        data->state.resume_from = 0;
      }
    }
    else
      sendbuf = xfer_ulbuf;

    /* write the data to the target */
    nwrite = write(fd, sendbuf, nread);
    if((size_t)nwrite != nread) {
      result = CURLE_SEND_ERROR;
      break;
    }

    bytecount += nread;

    Curl_pgrsSetUploadCounter(data, bytecount);

    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(!result && Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

out:
  close(fd);
  Curl_multi_xfer_ulbuf_release(data, xfer_ulbuf);

  return result;
}